

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          (VectorFormatter<DefaultFormatter> *this,
          ParamsStream<VectorWriter_&,_TransactionSerParams> *s,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *v)

{
  long lVar1;
  pointer pvVar2;
  value_type *elem;
  pointer v_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<ParamsStream<VectorWriter&,TransactionSerParams>>
            (s,((long)(v->
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(v->
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pvVar2 = (v->
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (v_00 = (v->
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; v_00 != pvVar2; v_00 = v_00 + 1) {
    Serialize<ParamsStream<VectorWriter&,TransactionSerParams>,unsigned_char,std::allocator<unsigned_char>>
              (s,v_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }